

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<TPZFlopCounter>::AutoFill
          (TPZMatrix<TPZFlopCounter> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  TPZMatrix<TPZFlopCounter> *pTVar1;
  TPZMatrix<TPZFlopCounter> *pTVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  TPZBaseMatrix *in_RDI;
  double __x;
  double __x_00;
  double dVar7;
  double __x_01;
  double dVar8;
  char *in_stack_000000d8;
  char *in_stack_000000e0;
  TPZFlopCounter sum;
  TPZFlopCounter val;
  int64_t j;
  int64_t i;
  TPZFlopCounter in_stack_fffffffffffffee0;
  TPZMatrix<TPZFlopCounter> *in_stack_fffffffffffffee8;
  TPZMatrix<TPZFlopCounter> *in_stack_fffffffffffffef8;
  double local_c8;
  TPZFlopCounter local_c0 [2];
  REAL local_b0;
  double local_a8;
  TPZFlopCounter local_a0;
  REAL local_98 [2];
  double local_88;
  TPZFlopCounter local_80;
  REAL local_78;
  double local_68;
  TPZFlopCounter local_60;
  undefined1 local_58 [8];
  double local_50;
  TPZFlopCounter local_48;
  TPZFlopCounter local_40;
  TPZFlopCounter local_38;
  TPZMatrix<TPZFlopCounter> *local_30;
  TPZMatrix<TPZFlopCounter> *local_28;
  int local_1c;
  
  local_1c = in_ECX;
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xd])(in_RDI,in_RSI,in_RDX);
  TPZFlopCounter::TPZFlopCounter(&local_38);
  TPZFlopCounter::TPZFlopCounter(&local_40);
  for (local_28 = (TPZMatrix<TPZFlopCounter> *)0x0; pTVar1 = local_28,
      iVar5 = TPZBaseMatrix::Rows(in_RDI), (long)pTVar1 < iVar5;
      local_28 = (TPZMatrix<TPZFlopCounter> *)
                 ((long)&(local_28->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1)) {
    local_50 = 0.0;
    TPZFlopCounter::TPZFlopCounter(&local_48,&local_50);
    local_40.fVal = local_48.fVal;
    local_30 = (TPZMatrix<TPZFlopCounter> *)0x0;
    if (local_1c != 0) {
      for (; pTVar2 = local_28, pTVar1 = local_30, (long)local_30 < (long)local_28;
          local_30 = (TPZMatrix<TPZFlopCounter> *)
                     ((long)&(local_30->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1))
      {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_30,local_28);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,pTVar2,pTVar1,local_58);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        local_68 = fabs(__x);
        TPZFlopCounter::TPZFlopCounter(&local_60,&local_68);
        TPZFlopCounter::operator+=(&local_40,&local_60);
      }
    }
    for (; pTVar1 = local_30, iVar5 = TPZBaseMatrix::Cols(in_RDI), (long)pTVar1 < iVar5;
        local_30 = (TPZMatrix<TPZFlopCounter> *)
                   ((long)&(local_30->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1)) {
      local_78 = (REAL)GetRandomVal(in_stack_fffffffffffffef8);
      local_38 = (TPZFlopCounter)local_78;
      if (local_28 != local_30) {
        local_88 = fabs(local_78);
        TPZFlopCounter::TPZFlopCounter(&local_80,&local_88);
        TPZFlopCounter::operator+=(&local_40,&local_80);
      }
      iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                        (in_RDI,local_28,local_30,&local_38);
      if (iVar4 == 0) {
        Error(in_stack_000000e0,in_stack_000000d8);
      }
    }
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 == iVar6) {
      dVar7 = fabs(__x_00);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      dVar8 = fabs(__x_01);
      pTVar1 = local_28;
      if (dVar8 < dVar7) {
        local_a8 = 1.0;
        in_stack_fffffffffffffef8 = local_28;
        TPZFlopCounter::TPZFlopCounter(&local_a0,&local_a8);
        local_98[0] = (REAL)TPZFlopCounter::operator+
                                      ((TPZFlopCounter *)in_stack_fffffffffffffee8,
                                       in_stack_fffffffffffffee0.fVal);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,pTVar1,in_stack_fffffffffffffef8,local_98);
      }
      local_b0 = local_40.fVal;
      bVar3 = IsZero<TPZFlopCounter>(in_stack_fffffffffffffee0);
      if (bVar3) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        bVar3 = IsZero<TPZFlopCounter>(in_stack_fffffffffffffee0);
        if (bVar3) {
          local_c8 = 1.0;
          in_stack_fffffffffffffee0.fVal = (REAL)local_28;
          in_stack_fffffffffffffee8 = local_28;
          TPZFlopCounter::TPZFlopCounter(local_c0,&local_c8);
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                    (in_RDI,in_stack_fffffffffffffee0.fVal,in_stack_fffffffffffffee8,local_c0);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}